

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<unsigned_short,unsigned_short,duckdb::NotEquals,true,false,true,true>
                (unsigned_short *ldata,unsigned_short *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  idx_t iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  
  puVar3 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  uVar6 = 0;
  lVar9 = 0;
  iVar5 = 0;
  uVar10 = 0;
  do {
    if (uVar6 == count + 0x3f >> 6) {
      return iVar5;
    }
    if (puVar3 == (unsigned_long *)0x0) {
      uVar8 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar8 = count;
      }
LAB_003a2311:
      while (uVar11 = uVar10, uVar11 < uVar8) {
        uVar10 = uVar11;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar10 = (ulong)sel->sel_vector[uVar11];
        }
        uVar1 = *ldata;
        uVar2 = rdata[uVar11];
        true_sel->sel_vector[iVar5] = (sel_t)uVar10;
        iVar5 = iVar5 + (uVar1 != uVar2);
        false_sel->sel_vector[lVar9] = (sel_t)uVar10;
        lVar9 = lVar9 + (ulong)(uVar1 == uVar2);
        uVar10 = uVar11 + 1;
      }
    }
    else {
      uVar4 = puVar3[uVar6];
      uVar11 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar11 = count;
      }
      uVar8 = uVar11;
      if (uVar4 == 0xffffffffffffffff) goto LAB_003a2311;
      if (uVar4 == 0) {
        for (; uVar10 < uVar11; uVar10 = uVar10 + 1) {
          uVar8 = uVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar8 = (ulong)sel->sel_vector[uVar10];
          }
          false_sel->sel_vector[lVar9] = (sel_t)uVar8;
          lVar9 = lVar9 + 1;
        }
      }
      else {
        for (uVar8 = 0; uVar7 = uVar10 + uVar8, uVar7 < uVar11; uVar8 = uVar8 + 1) {
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar7 = (ulong)sel->sel_vector[uVar10 + uVar8];
          }
          if ((uVar4 >> (uVar8 & 0x3f) & 1) == 0) {
            bVar12 = false;
          }
          else {
            bVar12 = *ldata != rdata[uVar10 + uVar8];
          }
          true_sel->sel_vector[iVar5] = (sel_t)uVar7;
          iVar5 = iVar5 + bVar12;
          false_sel->sel_vector[lVar9] = (sel_t)uVar7;
          lVar9 = lVar9 + (ulong)(bVar12 ^ 1);
        }
        uVar11 = uVar10 + uVar8;
      }
    }
    uVar6 = uVar6 + 1;
    uVar10 = uVar11;
  } while( true );
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}